

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_mutex.hpp
# Opt level: O1

bool __thiscall
yamc::checked::timed_mutex::
do_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (timed_mutex *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp,char *emsg)

{
  cv_status cVar1;
  id tid;
  bool bVar2;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_40;
  
  tid._M_thread = pthread_self();
  local_40._M_device = (mutex_type *)(this + 0x38);
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  if (*(native_handle_type *)this == tid._M_thread) {
    abort();
  }
  do {
    if (*(long *)this == 0) goto LAB_00197376;
    cVar1 = std::condition_variable::
            __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ((condition_variable *)(this + 8),&local_40,tp);
  } while (cVar1 != timeout);
  if (*(long *)this == 0) {
LAB_00197376:
    *(native_handle_type *)this = tid._M_thread;
    bVar2 = true;
    validator::deadlock::locked((uintptr_t)this,tid,false);
  }
  else {
    bVar2 = false;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return bVar2;
}

Assistant:

bool do_try_lockwait(const std::chrono::time_point<Clock, Duration>& tp, const char* emsg)
  {
    const auto tid = std::this_thread::get_id();
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    if (owner_ == tid) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
      (void)emsg;  // suppress "unused variable" warning
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), emsg);
#endif
    }
    while (owner_ != std::thread::id()) {
      if (cv_.wait_until(lk, tp) == std::cv_status::timeout) {
        if (owner_ == std::thread::id())  // re-check predicate
          break;
        return false;
      }
    }
    owner_ = tid;
    detail::validator::locked(reinterpret_cast<uintptr_t>(this), tid, false);
    return true;
  }